

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_card.cc
# Opt level: O0

string * __thiscall hanabi_learning_env::HanabiCard::ToString_abi_cxx11_(HanabiCard *this)

{
  bool bVar1;
  int iVar2;
  HanabiCard *in_RSI;
  string *in_RDI;
  char __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  allocator *paVar3;
  string local_68 [32];
  string local_48 [55];
  allocator local_11 [17];
  
  bVar1 = IsValid(in_RSI);
  if (bVar1) {
    std::__cxx11::string::string(local_68);
    iVar2 = Color(in_RSI);
    ColorIndexToChar(iVar2);
    __rhs = (char)((uint)iVar2 >> 0x18);
    std::operator+(in_stack_ffffffffffffff78,__rhs);
    iVar2 = Rank(in_RSI);
    RankIndexToChar(iVar2);
    std::operator+(in_stack_ffffffffffffff78,__rhs);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
  }
  else {
    paVar3 = local_11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"XX",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

std::string HanabiCard::ToString() const {
  if (!IsValid()) {
    return std::string("XX");
  }
  return std::string() + ColorIndexToChar(Color()) + RankIndexToChar(Rank());
}